

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O2

int Cec_ManSatCheckNode(Cec_ManSat_t *p,Gia_Obj_t *pObj)

{
  Cec_ParSat_t *pCVar1;
  sat_solver *s;
  ABC_INT64_T AVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  int iVar9;
  int Lit;
  
  pGVar8 = p->pAig->pObjs;
  iVar7 = 1;
  if (pGVar8 != pObj) {
    if ((Gia_Obj_t *)((ulong)pGVar8 ^ 1) == pObj) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                    ,0x1e1,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
    }
    pCVar1 = p->pPars;
    iVar4 = pCVar1->nBTLimit;
    iVar3 = p->nCallsSince;
    p->nCallsSince = iVar3 + 1;
    p->nSatTotal = p->nSatTotal + 1;
    pGVar8 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
    if ((p->pSat == (sat_solver *)0x0) ||
       (((pCVar1->nSatVarMax != 0 && (pCVar1->nSatVarMax < p->nSatVars)) &&
        (pCVar1->nCallsRecycle <= iVar3)))) {
      Cec_ManSatSolverRecycle(p);
    }
    Abc_Clock();
    Cec_CnfNodeAddToSolver(p,pGVar8);
    Abc_Clock();
    s = p->pSat;
    if (s->qtail != s->qhead) {
      iVar3 = sat_solver_simplify(s);
      if (iVar3 == 0) {
        __assert_fail("status != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x1fd,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      if (p->pSat->qtail != p->pSat->qhead) {
        __assert_fail("p->pSat->qtail == p->pSat->qhead",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x1fe,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
    }
    iVar3 = Cec_ObjSatNum(p,pGVar8);
    Lit = ((uint)pObj & 1) + iVar3 * 2;
    if ((p->pPars->fPolarFlip != 0) && (*(long *)pGVar8 < 0)) {
      Lit = Lit ^ 1;
    }
    aVar5 = Abc_Clock();
    AVar2 = (p->pSat->stats).conflicts;
    Abc_Clock();
    iVar4 = sat_solver_solve(p->pSat,&Lit,(lit *)&stack0xffffffffffffffd0,(long)iVar4,0,0,0);
    aVar6 = Abc_Clock();
    iVar3 = (int)aVar6 - (int)aVar5;
    iVar9 = (int)AVar2;
    if (iVar4 == 1) {
      p->timeSatSat = p->timeSatSat + iVar3;
      p->nSatSat = p->nSatSat + 1;
      p->nConfSat = p->nConfSat + ((int)(p->pSat->stats).conflicts - iVar9);
      iVar7 = 0;
    }
    else if (iVar4 == -1) {
      p->timeSatUnsat = p->timeSatUnsat + iVar3;
      Lit = Lit ^ 1;
      iVar4 = sat_solver_addclause(p->pSat,&Lit,(lit *)&stack0xffffffffffffffd0);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecSolve.c"
                      ,0x216,"int Cec_ManSatCheckNode(Cec_ManSat_t *, Gia_Obj_t *)");
      }
      p->nSatUnsat = p->nSatUnsat + 1;
      p->nConfUnsat = p->nConfUnsat + ((int)(p->pSat->stats).conflicts - iVar9);
    }
    else {
      p->timeSatUndec = p->timeSatUndec + iVar3;
      p->nSatUndec = p->nSatUndec + 1;
      p->nConfUndec = p->nConfUndec + ((int)(p->pSat->stats).conflicts - iVar9);
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

int Cec_ManSatCheckNode( Cec_ManSat_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pObjR = Gia_Regular(pObj);
    int nBTLimit = p->pPars->nBTLimit;
    int Lit, RetValue, status, nConflicts;
    abctime clk, clk2;

    if ( pObj == Gia_ManConst0(p->pAig) )
        return 1;
    if ( pObj == Gia_ManConst1(p->pAig) )
    {
        assert( 0 );
        return 0;
    }

    p->nCallsSince++;  // experiment with this!!!
    p->nSatTotal++;
    
    // check if SAT solver needs recycling
    if ( p->pSat == NULL || 
        (p->pPars->nSatVarMax && 
         p->nSatVars > p->pPars->nSatVarMax && 
         p->nCallsSince > p->pPars->nCallsRecycle) )
        Cec_ManSatSolverRecycle( p );

    // if the nodes do not have SAT variables, allocate them
clk2 = Abc_Clock();
    Cec_CnfNodeAddToSolver( p, pObjR );
//ABC_PRT( "cnf", Abc_Clock() - clk2 );
//Abc_Print( 1, "%d \n", p->pSat->size );

clk2 = Abc_Clock();
//    Cec_SetActivityFactors( p, pObjR ); 
//ABC_PRT( "act", Abc_Clock() - clk2 );

    // propage unit clauses
    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
    Lit = toLitCond( Cec_ObjSatNum(p,pObjR), Gia_IsComplement(pObj) );
    if ( p->pPars->fPolarFlip )
    {
        if ( pObjR->fPhase )  Lit = lit_neg( Lit );
    }
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
clk = Abc_Clock();
    nConflicts = p->pSat->stats.conflicts;

clk2 = Abc_Clock();
    RetValue = sat_solver_solve( p->pSat, &Lit, &Lit + 1, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//ABC_PRT( "sat", Abc_Clock() - clk2 );

    if ( RetValue == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        Lit = lit_neg( Lit );
        RetValue = sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
        assert( RetValue );
        p->nSatUnsat++;
        p->nConfUnsat += p->pSat->stats.conflicts - nConflicts;       
//Abc_Print( 1, "UNSAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 1;
    }
    else if ( RetValue == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        p->nSatSat++;
        p->nConfSat += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "SAT after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return 0;
    }
    else // if ( RetValue == l_Undef )
    {
p->timeSatUndec += Abc_Clock() - clk;
        p->nSatUndec++;
        p->nConfUndec += p->pSat->stats.conflicts - nConflicts;
//Abc_Print( 1, "UNDEC after %d conflicts\n", p->pSat->stats.conflicts - nConflicts );
        return -1;
    }
}